

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  lu_byte lVar1;
  lua_Hook p_Var2;
  
  p_Var2 = (lua_Hook)0x0;
  if (mask != 0) {
    p_Var2 = func;
  }
  L->hook = p_Var2;
  L->basehookcount = count;
  L->hookcount = count;
  lVar1 = (lu_byte)mask;
  if (func == (lua_Hook)0x0) {
    lVar1 = '\0';
  }
  L->hookmask = lVar1;
  return 1;
}

Assistant:

LUA_API int lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
  return 1;
}